

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metee_linux.c
# Opt level: O2

TEESTATUS TeeInitFull(PTEEHANDLE handle,GUID *guid,tee_device_address device,uint32_t log_level,
                     TeeLogCallback log_callback)

{
  TEESTATUS TVar1;
  tee_log_level tVar2;
  uint uVar3;
  mei *me;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  ulong uVar7;
  TeeLogCallback p_Var8;
  undefined8 uStackY_40;
  
  TVar1 = 4;
  if (handle == (PTEEHANDLE)0x0 || guid == (GUID *)0x0) {
    return 4;
  }
  handle->protcolVer = '\0';
  *(undefined3 *)&handle->field_0x11 = 0;
  handle->log_level = TEE_LOG_LEVEL_QUIET;
  handle->log_callback = (TeeLogCallback)0x0;
  handle->handle = (void *)0x0;
  handle->maxMsgLen = 0;
  tVar2 = TEE_LOG_LEVEL_VERBOSE;
  if (log_level < 2) {
    tVar2 = log_level;
  }
  handle->log_level = tVar2;
  handle->log_callback = log_callback;
  if (log_level >= 2) {
    if (log_callback == (TeeLogCallback)0x0) {
      __syslog_chk(7,1,"TEELIB: (%s:%s():%d) Entry\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O2/metee/src/linux/metee_linux.c"
                   ,"TeeInitFull",0x70);
    }
    else {
      (*log_callback)(false,"TEELIB: (%s:%s():%d) Entry\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O2/metee/src/linux/metee_linux.c"
                      ,"TeeInitFull",0x70);
    }
    if (log_level < 3) goto LAB_0011dbc9;
    if (handle->log_level == TEE_LOG_LEVEL_QUIET) {
      return 4;
    }
    p_Var8 = handle->log_callback;
    if (p_Var8 != (TeeLogCallback)0x0) {
      pcVar5 = "TEELIB: (%s:%s():%d) LogLevel %u is too big.\n";
      uVar6 = 0x73;
      uVar7 = (ulong)log_level;
      goto LAB_0011dd00;
    }
    pcVar5 = "TEELIB: (%s:%s():%d) LogLevel %u is too big.\n";
    uStackY_40 = 0x73;
LAB_0011df4d:
    TVar1 = 4;
LAB_0011dfc2:
    __syslog_chk(3,1,pcVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O2/metee/src/linux/metee_linux.c"
                 ,"TeeInitFull",uStackY_40);
    return TVar1;
  }
LAB_0011dbc9:
  pcVar5 = device.data._0_8_;
  if (device.type == TEE_DEVICE_TYPE_HANDLE) {
    pcVar4 = (char *)(ulong)device.data.bdf.value.segment;
    if (device.data.handle == -1) {
      if (handle->log_level == TEE_LOG_LEVEL_QUIET) {
        return 4;
      }
      p_Var8 = handle->log_callback;
      TVar1 = 4;
      if (p_Var8 == (TeeLogCallback)0x0) {
        pcVar5 = "TEELIB: (%s:%s():%d) Handle is invalid.\n";
        uStackY_40 = 0x88;
        goto LAB_0011dfc2;
      }
      pcVar5 = "TEELIB: (%s:%s():%d) Handle is invalid.\n";
      uVar6 = 0x88;
      goto LAB_0011dd7c;
    }
  }
  else {
    pcVar4 = pcVar5;
    if (device.type == TEE_DEVICE_TYPE_PATH) {
      if (pcVar5 == (char *)0x0) {
        if (handle->log_level == TEE_LOG_LEVEL_QUIET) {
          return 4;
        }
        p_Var8 = handle->log_callback;
        TVar1 = 4;
        if (p_Var8 != (TeeLogCallback)0x0) {
          pcVar5 = "TEELIB: (%s:%s():%d) Path is NULL.\n";
          uVar6 = 0x81;
          goto LAB_0011dd7c;
        }
        pcVar5 = "TEELIB: (%s:%s():%d) Path is NULL.\n";
        uStackY_40 = 0x81;
        goto LAB_0011dfc2;
      }
    }
    else {
      if (device.type != TEE_DEVICE_TYPE_NONE) {
        if (handle->log_level == TEE_LOG_LEVEL_QUIET) {
          return 4;
        }
        p_Var8 = handle->log_callback;
        if (p_Var8 != (TeeLogCallback)0x0) {
          pcVar5 = "TEELIB: (%s:%s():%d) Wrong device type %u.\n";
          uVar6 = 0x8f;
          uVar7 = (ulong)device.type;
LAB_0011dd00:
          (*p_Var8)(true,pcVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O2/metee/src/linux/metee_linux.c"
                    ,"TeeInitFull",uVar6,uVar7);
          return 4;
        }
        pcVar5 = "TEELIB: (%s:%s():%d) Wrong device type %u.\n";
        uStackY_40 = 0x8f;
        goto LAB_0011dfc2;
      }
      if (pcVar5 != (char *)0x0) {
        if (handle->log_level == TEE_LOG_LEVEL_QUIET) {
          return 4;
        }
        p_Var8 = handle->log_callback;
        TVar1 = 4;
        if (p_Var8 != (TeeLogCallback)0x0) {
          pcVar5 = "TEELIB: (%s:%s():%d) Path is not NULL.\n";
          uVar6 = 0x7a;
          goto LAB_0011dd7c;
        }
        pcVar5 = "TEELIB: (%s:%s():%d) Path is not NULL.\n";
        uStackY_40 = 0x7a;
        goto LAB_0011df4d;
      }
    }
  }
  me = (mei *)malloc(0x50);
  if (me == (mei *)0x0) {
    TVar1 = 1;
    if (handle->log_level == TEE_LOG_LEVEL_QUIET) {
      return 1;
    }
    p_Var8 = handle->log_callback;
    if (p_Var8 != (TeeLogCallback)0x0) {
      pcVar5 = "TEELIB: (%s:%s():%d) Cannot alloc intl structure\n";
      uVar6 = 0x96;
LAB_0011dd7c:
      (*p_Var8)(true,pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O2/metee/src/linux/metee_linux.c"
                ,"TeeInitFull",uVar6);
      return TVar1;
    }
    pcVar5 = "TEELIB: (%s:%s():%d) Cannot alloc intl structure\n";
    uStackY_40 = 0x96;
    goto LAB_0011dfc2;
  }
  if (device.type == TEE_DEVICE_TYPE_HANDLE) {
    uVar3 = mei_init_fd(me,(int)pcVar4,(uuid_le *)guid,'\0',log_level == 2);
    if (uVar3 == 0) {
      mei_set_log_callback(me,log_callback);
      mei_set_log_level(me,(uint)(log_level == 2));
      goto LAB_0011de47;
    }
  }
  else {
    if (device.type != TEE_DEVICE_TYPE_PATH) {
      pcVar5 = "/dev/mei0";
    }
    uVar3 = mei_init_with_log(me,pcVar5,(uuid_le *)guid,'\0',log_level == 2,log_callback);
    if (uVar3 == 0) {
LAB_0011de47:
      uVar3 = pipe((int *)(me + 1));
      if (uVar3 == 0) {
        handle->handle = me;
        return 0;
      }
      mei_deinit(me);
      free(me);
      if (handle->log_level != TEE_LOG_LEVEL_QUIET) {
        if (handle->log_callback == (TeeLogCallback)0x0) {
          __syslog_chk(3,1,"TEELIB: (%s:%s():%d) Cannot init mei, rc = %d\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O2/metee/src/linux/metee_linux.c"
                       ,"TeeInitFull",0xb9,uVar3);
        }
        else {
          (*handle->log_callback)
                    (true,"TEELIB: (%s:%s():%d) Cannot init mei, rc = %d\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O2/metee/src/linux/metee_linux.c"
                     ,"TeeInitFull",0xb9,(ulong)uVar3);
        }
      }
      goto LAB_0011dffc;
    }
  }
  free(me);
  if (handle->log_level != TEE_LOG_LEVEL_QUIET) {
    if (handle->log_callback == (TeeLogCallback)0x0) {
      __syslog_chk(3,1,"TEELIB: (%s:%s():%d) Cannot init mei, rc = %d\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O2/metee/src/linux/metee_linux.c"
                   ,"TeeInitFull",0xb1,uVar3);
    }
    else {
      (*handle->log_callback)
                (true,"TEELIB: (%s:%s():%d) Cannot init mei, rc = %d\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O2/metee/src/linux/metee_linux.c"
                 ,"TeeInitFull",0xb1,(ulong)uVar3);
    }
  }
LAB_0011dffc:
  TVar1 = errno2status_init((long)(int)uVar3);
  return TVar1;
}

Assistant:

TEESTATUS TEEAPI TeeInitFull(IN OUT PTEEHANDLE handle, IN const GUID* guid,
			     IN const struct tee_device_address device,
			     IN uint32_t log_level, IN OPTIONAL TeeLogCallback log_callback)
{
	struct metee_linux_intl *intl;
	TEESTATUS  status;
	int rc;
	bool verbose = (log_level == TEE_LOG_LEVEL_VERBOSE);

	if (guid == NULL || handle == NULL) {
		return TEE_INVALID_PARAMETER;
	}

	__tee_init_handle(handle);
	handle->log_level = (log_level >= TEE_LOG_LEVEL_MAX) ? TEE_LOG_LEVEL_VERBOSE : log_level;
	handle->log_callback = log_callback;

	FUNC_ENTRY(handle);

	if (log_level >= TEE_LOG_LEVEL_MAX) {
		ERRPRINT(handle, "LogLevel %u is too big.\n", log_level);
		status = TEE_INVALID_PARAMETER;
		goto End;
	}
	switch (device.type) {
	case TEE_DEVICE_TYPE_NONE:
		if (device.data.path != NULL) {
			ERRPRINT(handle, "Path is not NULL.\n");
			status = TEE_INVALID_PARAMETER;
			goto End;
		}
		break;
	case TEE_DEVICE_TYPE_PATH:
		if (device.data.path == NULL) {
			ERRPRINT(handle, "Path is NULL.\n");
			status = TEE_INVALID_PARAMETER;
			goto End;
		}
		break;
	case TEE_DEVICE_TYPE_HANDLE:
		if (device.data.handle == TEE_INVALID_DEVICE_HANDLE) {
			ERRPRINT(handle, "Handle is invalid.\n");
			status = TEE_INVALID_PARAMETER;
			goto End;
		}
		break;
	case TEE_DEVICE_TYPE_GUID:
	default:
		ERRPRINT(handle, "Wrong device type %u.\n", device.type);
		status = TEE_INVALID_PARAMETER;
		goto End;
	}

	intl = malloc(sizeof(struct metee_linux_intl));
	if (!intl) {
		ERRPRINT(handle, "Cannot alloc intl structure\n");
		status = TEE_INTERNAL_ERROR;
		goto End;
	}

	switch (device.type) {
	case TEE_DEVICE_TYPE_NONE:
		rc = mei_init_with_log(&intl->me, MEI_DEFAULT_DEVICE,
			(uuid_le*)guid, 0, verbose, log_callback);
		break;
	case TEE_DEVICE_TYPE_PATH:
		rc = mei_init_with_log(&intl->me, device.data.path,
			(uuid_le*)guid, 0, verbose, log_callback);
		break;
	case TEE_DEVICE_TYPE_HANDLE:
		rc = mei_init_fd(&intl->me, device.data.handle, (uuid_le*)guid, 0, verbose);
		if (!rc) {
			mei_set_log_callback(&intl->me, log_callback);
			mei_set_log_level(&intl->me, verbose);
		}
		break;
	default:
		rc = -EFAULT;
		break;
	}
	if (rc) {
		free(intl);
		ERRPRINT(handle, "Cannot init mei, rc = %d\n", rc);
		status = errno2status_init(rc);
		goto End;
	}
	rc = pipe(intl->cancel_pipe);
	if (rc) {
		mei_deinit(&intl->me);
		free(intl);
		ERRPRINT(handle, "Cannot init mei, rc = %d\n", rc);
		status = errno2status_init(rc);
		goto End;
	}
	handle->handle = intl;

	status = TEE_SUCCESS;

End:
	return status;
}